

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O0

void boost::algorithm::
     trim_right_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_any_ofF<char> *IsSpace)

{
  is_any_ofF<char> *this;
  is_any_ofF<char> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff60;
  is_any_ofF<char> *in_stack_ffffffffffffff68;
  undefined8 local_60;
  is_any_ofF<char> *in_stack_ffffffffffffffa8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  undefined8 local_18;
  
  range_adl_barrier::begin<std::__cxx11::string>(in_stack_ffffffffffffff58);
  range_adl_barrier::end<std::__cxx11::string>(in_stack_ffffffffffffff58);
  detail::is_any_ofF<char>::is_any_ofF(in_RDI,in_stack_ffffffffffffff68);
  detail::
  trim_end<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::algorithm::detail::is_any_ofF<char>>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_stack_ffffffffffffff60,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff58);
  range_adl_barrier::end<std::__cxx11::string>(in_stack_ffffffffffffff58);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_stack_ffffffffffffff60,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff58);
  this = (is_any_ofF<char> *)std::__cxx11::string::erase(in_RDI,local_18,local_60);
  detail::is_any_ofF<char>::~is_any_ofF(this);
  return;
}

Assistant:

inline void trim_right_if(SequenceT& Input, PredicateT IsSpace)
        {
            Input.erase(
                ::boost::algorithm::detail::trim_end( 
                    ::boost::begin(Input), 
                    ::boost::end(Input), 
                    IsSpace ),
                ::boost::end(Input)
                );
        }